

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

void __thiscall
Catch::CumulativeReporterBase::sectionStarting
          (CumulativeReporterBase *this,SectionInfo *sectionInfo)

{
  bool bVar1;
  reference this_00;
  SectionNode *pSVar2;
  reference other;
  __normal_iterator<Catch::Ptr<Catch::CumulativeReporterBase::SectionNode>_*,_std::vector<Catch::Ptr<Catch::CumulativeReporterBase::SectionNode>,_std::allocator<Catch::Ptr<Catch::CumulativeReporterBase::SectionNode>_>_>_>
  local_100;
  BySectionInfo local_f8;
  __normal_iterator<Catch::Ptr<Catch::CumulativeReporterBase::SectionNode>_*,_std::vector<Catch::Ptr<Catch::CumulativeReporterBase::SectionNode>,_std::allocator<Catch::Ptr<Catch::CumulativeReporterBase::SectionNode>_>_>_>
  local_f0;
  __normal_iterator<Catch::Ptr<Catch::CumulativeReporterBase::SectionNode>_*,_std::vector<Catch::Ptr<Catch::CumulativeReporterBase::SectionNode>,_std::allocator<Catch::Ptr<Catch::CumulativeReporterBase::SectionNode>_>_>_>
  local_e8;
  __normal_iterator<Catch::Ptr<Catch::CumulativeReporterBase::SectionNode>_*,_std::vector<Catch::Ptr<Catch::CumulativeReporterBase::SectionNode>,_std::allocator<Catch::Ptr<Catch::CumulativeReporterBase::SectionNode>_>_>_>
  local_e0;
  __normal_iterator<const_Catch::Ptr<Catch::CumulativeReporterBase::SectionNode>_*,_std::vector<Catch::Ptr<Catch::CumulativeReporterBase::SectionNode>,_std::allocator<Catch::Ptr<Catch::CumulativeReporterBase::SectionNode>_>_>_>
  local_d8;
  const_iterator it;
  SectionNode *parentNode;
  Ptr<Catch::CumulativeReporterBase::SectionNode> local_b8;
  Ptr<Catch::CumulativeReporterBase::SectionNode> node;
  undefined1 local_98 [8];
  SectionStats incompleteStats;
  SectionInfo *sectionInfo_local;
  CumulativeReporterBase *this_local;
  
  incompleteStats._120_8_ = sectionInfo;
  Counts::Counts((Counts *)&node);
  SectionStats::SectionStats((SectionStats *)local_98,sectionInfo,(Counts *)&node,0.0,false);
  Ptr<Catch::CumulativeReporterBase::SectionNode>::Ptr(&local_b8);
  bVar1 = std::
          vector<Catch::Ptr<Catch::CumulativeReporterBase::SectionNode>,_std::allocator<Catch::Ptr<Catch::CumulativeReporterBase::SectionNode>_>_>
          ::empty(&this->m_sectionStack);
  if (bVar1) {
    bVar1 = Ptr<Catch::CumulativeReporterBase::SectionNode>::operator!(&this->m_rootSection);
    if (bVar1) {
      pSVar2 = (SectionNode *)operator_new(0x100);
      SectionNode::SectionNode(pSVar2,(SectionStats *)local_98);
      Ptr<Catch::CumulativeReporterBase::SectionNode>::operator=(&this->m_rootSection,pSVar2);
    }
    Ptr<Catch::CumulativeReporterBase::SectionNode>::operator=(&local_b8,&this->m_rootSection);
  }
  else {
    this_00 = std::
              vector<Catch::Ptr<Catch::CumulativeReporterBase::SectionNode>,_std::allocator<Catch::Ptr<Catch::CumulativeReporterBase::SectionNode>_>_>
              ::back(&this->m_sectionStack);
    it._M_current =
         (Ptr<Catch::CumulativeReporterBase::SectionNode> *)
         Ptr<Catch::CumulativeReporterBase::SectionNode>::operator*(this_00);
    local_e8._M_current =
         (Ptr<Catch::CumulativeReporterBase::SectionNode> *)
         std::
         vector<Catch::Ptr<Catch::CumulativeReporterBase::SectionNode>,_std::allocator<Catch::Ptr<Catch::CumulativeReporterBase::SectionNode>_>_>
         ::begin(&((SectionNode *)it._M_current)->childSections);
    local_f0._M_current =
         (Ptr<Catch::CumulativeReporterBase::SectionNode> *)
         std::
         vector<Catch::Ptr<Catch::CumulativeReporterBase::SectionNode>,_std::allocator<Catch::Ptr<Catch::CumulativeReporterBase::SectionNode>_>_>
         ::end((vector<Catch::Ptr<Catch::CumulativeReporterBase::SectionNode>,_std::allocator<Catch::Ptr<Catch::CumulativeReporterBase::SectionNode>_>_>
                *)(it._M_current + 0x12));
    BySectionInfo::BySectionInfo(&local_f8,(SectionInfo *)incompleteStats._120_8_);
    local_e0 = std::
               find_if<__gnu_cxx::__normal_iterator<Catch::Ptr<Catch::CumulativeReporterBase::SectionNode>*,std::vector<Catch::Ptr<Catch::CumulativeReporterBase::SectionNode>,std::allocator<Catch::Ptr<Catch::CumulativeReporterBase::SectionNode>>>>,Catch::CumulativeReporterBase::BySectionInfo>
                         (local_e8,local_f0,&local_f8);
    __gnu_cxx::
    __normal_iterator<Catch::Ptr<Catch::CumulativeReporterBase::SectionNode>const*,std::vector<Catch::Ptr<Catch::CumulativeReporterBase::SectionNode>,std::allocator<Catch::Ptr<Catch::CumulativeReporterBase::SectionNode>>>>
    ::__normal_iterator<Catch::Ptr<Catch::CumulativeReporterBase::SectionNode>*>
              ((__normal_iterator<Catch::Ptr<Catch::CumulativeReporterBase::SectionNode>const*,std::vector<Catch::Ptr<Catch::CumulativeReporterBase::SectionNode>,std::allocator<Catch::Ptr<Catch::CumulativeReporterBase::SectionNode>>>>
                *)&local_d8,&local_e0);
    local_100._M_current =
         (Ptr<Catch::CumulativeReporterBase::SectionNode> *)
         std::
         vector<Catch::Ptr<Catch::CumulativeReporterBase::SectionNode>,_std::allocator<Catch::Ptr<Catch::CumulativeReporterBase::SectionNode>_>_>
         ::end((vector<Catch::Ptr<Catch::CumulativeReporterBase::SectionNode>,_std::allocator<Catch::Ptr<Catch::CumulativeReporterBase::SectionNode>_>_>
                *)(it._M_current + 0x12));
    bVar1 = __gnu_cxx::operator==(&local_d8,&local_100);
    if (bVar1) {
      pSVar2 = (SectionNode *)operator_new(0x100);
      SectionNode::SectionNode(pSVar2,(SectionStats *)local_98);
      Ptr<Catch::CumulativeReporterBase::SectionNode>::operator=(&local_b8,pSVar2);
      std::
      vector<Catch::Ptr<Catch::CumulativeReporterBase::SectionNode>,_std::allocator<Catch::Ptr<Catch::CumulativeReporterBase::SectionNode>_>_>
      ::push_back((vector<Catch::Ptr<Catch::CumulativeReporterBase::SectionNode>,_std::allocator<Catch::Ptr<Catch::CumulativeReporterBase::SectionNode>_>_>
                   *)(it._M_current + 0x12),&local_b8);
    }
    else {
      other = __gnu_cxx::
              __normal_iterator<const_Catch::Ptr<Catch::CumulativeReporterBase::SectionNode>_*,_std::vector<Catch::Ptr<Catch::CumulativeReporterBase::SectionNode>,_std::allocator<Catch::Ptr<Catch::CumulativeReporterBase::SectionNode>_>_>_>
              ::operator*(&local_d8);
      Ptr<Catch::CumulativeReporterBase::SectionNode>::operator=(&local_b8,other);
    }
  }
  std::
  vector<Catch::Ptr<Catch::CumulativeReporterBase::SectionNode>,_std::allocator<Catch::Ptr<Catch::CumulativeReporterBase::SectionNode>_>_>
  ::push_back(&this->m_sectionStack,&local_b8);
  Ptr<Catch::CumulativeReporterBase::SectionNode>::operator=(&this->m_deepestSection,&local_b8);
  Ptr<Catch::CumulativeReporterBase::SectionNode>::~Ptr(&local_b8);
  SectionStats::~SectionStats((SectionStats *)local_98);
  return;
}

Assistant:

virtual void sectionStarting( SectionInfo const& sectionInfo ) CATCH_OVERRIDE {
            SectionStats incompleteStats( sectionInfo, Counts(), 0, false );
            Ptr<SectionNode> node;
            if( m_sectionStack.empty() ) {
                if( !m_rootSection )
                    m_rootSection = new SectionNode( incompleteStats );
                node = m_rootSection;
            }
            else {
                SectionNode& parentNode = *m_sectionStack.back();
                SectionNode::ChildSections::const_iterator it =
                    std::find_if(   parentNode.childSections.begin(),
                                    parentNode.childSections.end(),
                                    BySectionInfo( sectionInfo ) );
                if( it == parentNode.childSections.end() ) {
                    node = new SectionNode( incompleteStats );
                    parentNode.childSections.push_back( node );
                }
                else
                    node = *it;
            }
            m_sectionStack.push_back( node );
            m_deepestSection = node;
        }